

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int lys_set_enabled(lys_module *module)

{
  ly_ctx *ctx_00;
  lys_module *node;
  lys_submodule *plVar1;
  int iVar2;
  ly_set *mods_00;
  ly_set *set;
  uint local_48;
  uint local_44;
  uint w;
  uint v;
  uint u;
  int i;
  ly_set *disabled;
  ly_set *mods;
  lys_module *mod;
  ly_ctx *ctx;
  lys_module *module_local;
  
  if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_set_enabled");
    module_local._4_4_ = 1;
  }
  else {
    if ((*(ushort *)&module->field_0x40 >> 6 & 1) != 0) {
      ctx_00 = module->ctx;
      for (v = 0; (int)v < (int)(uint)ctx_00->internal_module_count; v = v + 1) {
        if (module == (ctx_00->models).list[(int)v]) {
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Internal module \"%s\" cannot be removed.",module->name)
          ;
          return 1;
        }
      }
      mods_00 = ly_set_new();
      set = ly_set_new();
      lys_set_enabled_(mods_00,module);
      do {
        v = (uint)ctx_00->internal_module_count;
LAB_0010d97a:
        if ((ctx_00->models).used <= (int)v) {
          ctx_modules_redo_backlinks(mods_00);
          for (local_44 = 0; local_44 < mods_00->number; local_44 = local_44 + 1) {
            if ((*(ushort *)&(mods_00->set).s[local_44]->parent >> 7 & 1) != 0) {
              lys_sub_module_apply_devs_augs((lys_module *)(mods_00->set).s[local_44]);
            }
          }
          ly_set_free(mods_00);
          ly_set_free(set);
          (ctx_00->models).module_set_id = (ctx_00->models).module_set_id + 1;
          return 0;
        }
        node = (ctx_00->models).list[(int)v];
        if (((*(ushort *)&node->field_0x40 >> 6 & 1) == 0) ||
           (iVar2 = ly_set_contains(set,node), iVar2 != -1)) goto LAB_0010db17;
        w = 0;
        while ((w < node->imp_size &&
               ((*(ushort *)&(node->imp[w].module)->field_0x40 >> 6 & 1) == 0))) {
          w = w + 1;
        }
        if (w < node->imp_size) goto LAB_0010db17;
        w = 0;
LAB_0010da2e:
        if (node->imp_size <= w) goto LAB_0010db08;
        local_44 = 0;
        while( true ) {
          if (mods_00->number <= local_44) goto LAB_0010dafa;
          if (node->imp[w].module == (lys_module *)(mods_00->set).s[local_44]) break;
          local_44 = local_44 + 1;
        }
        *(ushort *)&node->field_0x40 = *(ushort *)&node->field_0x40 & 0xffbf;
        ly_set_add(mods_00,node,0);
        for (local_48 = 0; local_48 < node->inc_size; local_48 = local_48 + 1) {
          plVar1 = node->inc[local_48].submodule;
          plVar1->field_0x40 = plVar1->field_0x40 & 0xbf;
        }
      } while( true );
    }
    module_local._4_4_ = 0;
  }
  return module_local._4_4_;
LAB_0010db08:
  ly_set_add(set,node,0);
LAB_0010db17:
  v = v + 1;
  goto LAB_0010d97a;
LAB_0010dafa:
  w = w + 1;
  goto LAB_0010da2e;
}

Assistant:

API int
lys_set_enabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods, *disabled;
    int i;
    unsigned int u, v, w;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    } else if (!module->disabled) {
        /* already enabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < ctx->internal_module_count; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(ctx, LY_EINVAL, "Internal module \"%s\" cannot be removed.", mod->name);
            return EXIT_FAILURE;
        }
    }

    mods = ly_set_new();
    disabled = ly_set_new();

    /* enable the module, including its dependencies */
    lys_set_enabled_(mods, mod);

    /* we will go through the all disabled modules in the context, if the module has no dependency (import)
     * that is still disabled AND at least one of its imported module is from the set we are enabling now,
     * it is going to be also enabled. This way we try to revert everething that was possibly done by
     * lys_set_disabled(). */
checkdependency:
    for (i = ctx->internal_module_count; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (!mod->disabled || ly_set_contains(disabled, mod) != -1) {
            /* skip the enabled modules */
            continue;
        }

        /* check imported modules */
        for (u = 0; u < mod->imp_size; u++) {
            if (mod->imp[u].module->disabled) {
                /* it has disabled dependency so it must stay disabled */
                break;
            }
        }
        if (u < mod->imp_size) {
            /* it has disabled dependency, continue with the next module in the context */
            continue;
        }

        /* get know if at least one of the imported modules is being enabled this time */
        for (u = 0; u < mod->imp_size; u++) {
            for (v = 0; v < mods->number; v++) {
                if (mod->imp[u].module == mods->set.g[v]) {
                    /* yes, it is, so they are connected and we are going to enable it as well,
                     * it is not necessary to call recursive lys_set_enable_() because we already
                     * know that there is no disabled import to enable */
                    mod->disabled = 0;
                    ly_set_add(mods, mod, 0);
                    for (w = 0; w < mod->inc_size; w++) {
                        mod->inc[w].submodule->disabled = 0;
                    }
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to enable */
                    goto checkdependency;
                }
            }
        }

        /* this module is disabled, but it does not depend on any other disabled module and none
         * of its imports was not enabled in this call. No future enabling of the disabled module
         * will change this so we can remember the module and skip it next time we will have to go
         * through the all context because of the checkdependency goto.
         */
        ly_set_add(disabled, mod, 0);
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_redo_backlinks(mods);

    /* re-apply the deviations and augments */
    for (v = 0; v < mods->number; v++) {
        if (((struct lys_module *)mods->set.g[v])->implemented) {
            lys_sub_module_apply_devs_augs((struct lys_module *)mods->set.g[v]);
        }
    }

    /* free the sets */
    ly_set_free(mods);
    ly_set_free(disabled);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}